

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void mbedtls_ssl_write_version
               (uchar *version,int transport,mbedtls_ssl_protocol_version tls_version)

{
  ushort uVar1;
  
  uVar1 = (tls_version == 0x302 | 0x200) - (ushort)tls_version;
  if (transport != 1) {
    uVar1 = (ushort)tls_version;
  }
  *(ushort *)version = uVar1 << 8 | uVar1 >> 8;
  return;
}

Assistant:

void mbedtls_ssl_write_version(unsigned char version[2], int transport,
                               mbedtls_ssl_protocol_version tls_version)
{
    uint16_t tls_version_formatted;
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        tls_version_formatted =
            ~(tls_version - (tls_version == 0x0302 ? 0x0202 : 0x0201));
    } else
#else
    ((void) transport);
#endif
    {
        tls_version_formatted = (uint16_t) tls_version;
    }
    MBEDTLS_PUT_UINT16_BE(tls_version_formatted, version, 0);
}